

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::CanonicalIterator::next(UnicodeString *__return_storage_ptr__,CanonicalIterator *this)

{
  UnicodeString *this_00;
  ushort uVar1;
  int iVar2;
  int32_t *piVar3;
  int32_t *piVar4;
  ushort uVar5;
  ulong uVar6;
  long lVar7;
  
  this_00 = &this->buffer;
  if (this->done == '\0') {
    uVar1 = (this->buffer).fUnion.fStackFields.fLengthAndFlags;
    uVar5 = 2;
    if ((uVar1 & 1) == 0) {
      uVar5 = uVar1 & 0x1e;
    }
    (this->buffer).fUnion.fStackFields.fLengthAndFlags = uVar5;
    for (lVar7 = 0; lVar7 < this->pieces_length; lVar7 = lVar7 + 1) {
      UnicodeString::append(this_00,this->pieces[lVar7] + this->current[lVar7]);
    }
    piVar3 = this->pieces_lengths;
    piVar4 = this->current;
    for (uVar6 = (ulong)(uint)this->current_length; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      iVar2 = piVar4[uVar6 - 1];
      piVar4[uVar6 - 1] = iVar2 + 1;
      if (iVar2 + 1 < piVar3[uVar6 - 1]) goto LAB_00284829;
      piVar4[uVar6 - 1] = 0;
    }
    this->done = '\x01';
  }
  else {
    UnicodeString::setToBogus(this_00);
  }
LAB_00284829:
  UnicodeString::UnicodeString(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CanonicalIterator::next() {
    int32_t i = 0;

    if (done) {
      buffer.setToBogus();
      return buffer;
    }

    // delete old contents
    buffer.remove();

    // construct return value

    for (i = 0; i < pieces_length; ++i) {
        buffer.append(pieces[i][current[i]]);
    }
    //String result = buffer.toString(); // not needed

    // find next value for next time

    for (i = current_length - 1; ; --i) {
        if (i < 0) {
            done = TRUE;
            break;
        }
        current[i]++;
        if (current[i] < pieces_lengths[i]) break; // got sequence
        current[i] = 0;
    }
    return buffer;
}